

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gvar2.c
# Opt level: O0

LispPTR N_OP_gvar_(LispPTR tos,uint atom_index)

{
  uint *local_18;
  LispPTR *pslot;
  uint atom_index_local;
  LispPTR tos_local;
  
  if ((atom_index & 0xfff0000) == 0) {
    local_18 = (uint *)(AtomSpace + (ulong)(atom_index * 5) * 2 + 2);
  }
  else {
    local_18 = NativeAligned4FromLAddr(atom_index + 2);
  }
  if (((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x8000) == 0) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(tos,0);
    }
    else {
      htfind(tos,0);
    }
  }
  if (((*(ushort *)((ulong)(MDStypetbl + ((int)(*local_18 & 0xfffffff) >> 9)) ^ 2) & 0x8000) == 0)
     && (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(*local_18 & 0xfffffff,1);
    }
    else {
      htfind(*local_18 & 0xfffffff,1);
    }
  }
  *local_18 = *local_18 & 0xf0000000 | tos & 0xfffffff;
  return tos;
}

Assistant:

LispPTR N_OP_gvar_(LispPTR tos, unsigned int atom_index) {
  LispPTR *pslot; /* Native pointer to GVAR slot of atom */

#ifdef BIGATOMS
  if (0 != (atom_index & SEGMASK))
    pslot = (LispPTR *)NativeAligned4FromLAddr(atom_index + NEWATOM_VALUE_OFFSET);
  else
#endif /* BIGATOMS */

#ifdef BIGVM
    pslot = ((LispPTR *)AtomSpace) + (5 * atom_index) + NEWATOM_VALUE_PTROFF;
#else
    pslot = (LispPTR *)Valspace + atom_index;
#endif /* BIGVM */
  DEBUGGER(if (tos & 0xF0000000) error("Setting GVAR with high bits on"));
  FRPLPTR(((struct xpointer *)pslot)->addr, tos);
  return (tos);
}